

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LifNeuron.cpp
# Opt level: O0

void __thiscall LifNeuron::LifNeuron(LifNeuron *this)

{
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  local_80;
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  local_48;
  LifNeuron *local_10;
  LifNeuron *this_local;
  
  local_10 = this;
  INeuron::INeuron(&this->super_INeuron,0.0,0.01,true);
  *(undefined ***)this = &PTR_ProcessInputSpike_0010bc20;
  memset(&local_48,0,0x38);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::unordered_set(&local_48);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::operator=((unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
               *)&this->field_0x80,&local_48);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::~unordered_set(&local_48);
  memset(&local_80,0,0x38);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::unordered_set(&local_80);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::operator=((unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
               *)&this->field_0x48,&local_80);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::~unordered_set(&local_80);
  *(undefined4 *)&this->field_0xbc = 0;
  this->a = 0.0;
  this->vMaxThresh = 10.0;
  this->tau = 20.0;
  this->tps = -1.0;
  this->tOut = -1.0;
  this->fts = -1.0;
  *(undefined4 *)&this->field_0xc4 = 0x404f7084;
  this->field_0xc8 = 1;
  this->grad = 0.0;
  this->sigma_mu = 0.0;
  this->DlDV = 0.0;
  this->batchDlDV = 0.0;
  *(undefined4 *)&this->field_0xcc = 0;
  *(undefined4 *)&this->field_0xd0 = 0;
  *(undefined4 *)&this->field_0xc0 = 0;
  return;
}

Assistant:

LifNeuron::LifNeuron()
{
    outputSynapses = std::unordered_set<ISynapse *>();
    inputSynapses = std::unordered_set<ISynapse *>();
    potential = 0;
    a = 0;
    vMaxThresh = 10;
    tau = 20;
    tps = -1;
    tOut = -1;
    fts = -1;
    tRef = 3.2412423543293534542952;
    consistent = true;
    grad = 0;
    sigma_mu = 0;
    DlDV = 0;
    batchDlDV = 0;
    inputSpikeCounter = 0;
    outputSpikeCounter = 0;
    inductionAffectedSpikes = 0;
}